

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,XrSceneMeshesMSFT *value)

{
  NextChainResult NVar1;
  XrResult XVar2;
  allocator local_132;
  allocator local_131;
  string *local_130;
  string local_128;
  string error_message;
  string local_e8;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  
  XVar2 = XR_SUCCESS;
  local_130 = command_name;
  if (value->type != XR_TYPE_SCENE_MESHES_MSFT) {
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrSceneMeshesMSFT",value->type,
               "VUID-XrSceneMeshesMSFT-type-type",XR_TYPE_SCENE_MESHES_MSFT,
               "XR_TYPE_SCENE_MESHES_MSFT");
  }
  if (!check_pnext) goto LAB_0016ec4c;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar1 = ValidateNextChain(instance_info,local_130,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_128);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_128,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::string
              ((string *)&local_128,"VUID-XrSceneMeshesMSFT-next-unique",&local_132);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_78,objects_info);
    std::__cxx11::string::string
              ((string *)&local_e8,
               "Multiple structures of the same type(s) in \"next\" chain for XrSceneMeshesMSFT struct"
               ,&local_131);
    CoreValidLogMessage(instance_info,&local_128,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_130,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_78,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_78);
    std::__cxx11::string::~string((string *)&local_128);
LAB_0016ec1a:
    std::__cxx11::string::~string((string *)&error_message);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrSceneMeshesMSFT-next-next",(allocator *)&local_e8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_60,objects_info);
    std::__cxx11::string::string
              ((string *)&local_128,
               "Invalid structure(s) in \"next\" chain for XrSceneMeshesMSFT struct \"next\"",
               &local_132);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_130,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_60,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_60);
    goto LAB_0016ec1a;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_0016ec4c:
  if (((check_members && XVar2 == XR_SUCCESS) && (XVar2 = XR_SUCCESS, value->sceneMeshCount != 0))
     && (value->sceneMeshes == (XrSceneMeshMSFT *)0x0)) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrSceneMeshesMSFT-sceneMeshes-parameter",
               (allocator *)&local_e8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_90,objects_info);
    std::__cxx11::string::string
              ((string *)&local_128,
               "Structure XrSceneMeshesMSFT member sceneMeshCount is NULL, but value->sceneMeshCount is greater than 0"
               ,(allocator *)&valid_ext_structs);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_130,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_90,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_90);
    std::__cxx11::string::~string((string *)&error_message);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  return XVar2;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSceneMeshesMSFT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SCENE_MESHES_MSFT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrSceneMeshesMSFT",
                             value->type, "VUID-XrSceneMeshesMSFT-type-type", XR_TYPE_SCENE_MESHES_MSFT, "XR_TYPE_SCENE_MESHES_MSFT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrSceneMeshesMSFT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrSceneMeshesMSFT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrSceneMeshesMSFT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrSceneMeshesMSFT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrSceneMeshesMSFT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Optional array must be non-NULL when value->sceneMeshCount is non-zero
    if (0 != value->sceneMeshCount && nullptr == value->sceneMeshes) {
        CoreValidLogMessage(instance_info, "VUID-XrSceneMeshesMSFT-sceneMeshes-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrSceneMeshesMSFT member sceneMeshCount is NULL, but value->sceneMeshCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->sceneMeshes) {
        for (uint32_t value_scenemeshes_inc = 0; value_scenemeshes_inc < value->sceneMeshCount; ++value_scenemeshes_inc) {
            // Validate that the structure XrSceneMeshMSFT is valid
            xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                             check_members, true, &value->sceneMeshes[value_scenemeshes_inc]);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(instance_info, "VUID-XrSceneMeshesMSFT-sceneMeshes-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    "Structure XrSceneMeshesMSFT member sceneMeshes is invalid");
                return xr_result;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}